

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hardswish_x86_fma.cpp
# Opt level: O2

int __thiscall
ncnn::HardSwish_x86_fma::forward_inplace(HardSwish_x86_fma *this,Mat *bottom_top_blob,Option *opt)

{
  undefined4 uVar1;
  float fVar2;
  undefined1 auVar3 [32];
  void *pvVar4;
  size_t sVar5;
  size_t sVar6;
  _func_int **pp_Var7;
  _func_int *p_Var8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [32];
  int iVar11;
  ulong uVar12;
  ulong uVar13;
  undefined1 (*pauVar14) [32];
  long lVar15;
  long lVar16;
  int iVar17;
  undefined1 auVar18 [32];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar22 [16];
  float fVar21;
  undefined1 auVar23 [32];
  undefined1 auVar24 [16];
  undefined1 auVar25 [32];
  
  iVar11 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d * bottom_top_blob->elempack;
  uVar13 = 0;
  uVar12 = (ulong)(uint)bottom_top_blob->c;
  if (bottom_top_blob->c < 1) {
    uVar12 = uVar13;
  }
  auVar18._8_4_ = 0x3f800000;
  auVar18._0_8_ = 0x3f8000003f800000;
  auVar18._12_4_ = 0x3f800000;
  auVar18._16_4_ = 0x3f800000;
  auVar18._20_4_ = 0x3f800000;
  auVar18._24_4_ = 0x3f800000;
  auVar18._28_4_ = 0x3f800000;
  auVar19._8_4_ = 0x3f800000;
  auVar19._0_8_ = 0x3f8000003f800000;
  auVar19._12_4_ = 0x3f800000;
  do {
    if (uVar13 == uVar12) {
      return 0;
    }
    pvVar4 = bottom_top_blob->data;
    sVar5 = bottom_top_blob->elemsize;
    sVar6 = bottom_top_blob->cstep;
    pauVar14 = (undefined1 (*) [32])(sVar6 * uVar13 * sVar5 + (long)pvVar4);
    pp_Var7 = this->_vptr_HardSwish_x86_fma;
    lVar15 = 0;
    for (iVar17 = 0; iVar17 + 7 < iVar11; iVar17 = iVar17 + 8) {
      auVar3 = *pauVar14;
      uVar1 = *(undefined4 *)(&this->field_0xd4 + (long)pp_Var7[-3]);
      auVar23._4_4_ = uVar1;
      auVar23._0_4_ = uVar1;
      auVar23._8_4_ = uVar1;
      auVar23._12_4_ = uVar1;
      auVar23._16_4_ = uVar1;
      auVar23._20_4_ = uVar1;
      auVar23._24_4_ = uVar1;
      auVar23._28_4_ = uVar1;
      uVar1 = *(undefined4 *)(&this->field_0xd0 + (long)pp_Var7[-3]);
      auVar25._4_4_ = uVar1;
      auVar25._0_4_ = uVar1;
      auVar25._8_4_ = uVar1;
      auVar25._12_4_ = uVar1;
      auVar25._16_4_ = uVar1;
      auVar25._20_4_ = uVar1;
      auVar25._24_4_ = uVar1;
      auVar25._28_4_ = uVar1;
      auVar9 = vfmadd213ps_fma(auVar25,auVar3,auVar23);
      auVar23 = vmaxps_avx(ZEXT1632(auVar9),ZEXT1632(ZEXT816(0) << 0x40));
      auVar23 = vminps_avx(auVar23,auVar18);
      auVar10._4_4_ = auVar23._4_4_ * auVar3._4_4_;
      auVar10._0_4_ = auVar23._0_4_ * auVar3._0_4_;
      auVar10._8_4_ = auVar23._8_4_ * auVar3._8_4_;
      auVar10._12_4_ = auVar23._12_4_ * auVar3._12_4_;
      auVar10._16_4_ = auVar23._16_4_ * auVar3._16_4_;
      auVar10._20_4_ = auVar23._20_4_ * auVar3._20_4_;
      auVar10._24_4_ = auVar23._24_4_ * auVar3._24_4_;
      auVar10._28_4_ = auVar3._28_4_;
      *pauVar14 = auVar10;
      pauVar14 = pauVar14 + 1;
      lVar15 = lVar15 + 8;
    }
    pp_Var7 = this->_vptr_HardSwish_x86_fma;
    for (; iVar17 + 3 < iVar11; iVar17 = iVar17 + 4) {
      auVar9 = *(undefined1 (*) [16])*pauVar14;
      uVar1 = *(undefined4 *)(&this->field_0xd4 + (long)pp_Var7[-3]);
      auVar22._4_4_ = uVar1;
      auVar22._0_4_ = uVar1;
      auVar22._8_4_ = uVar1;
      auVar22._12_4_ = uVar1;
      uVar1 = *(undefined4 *)(&this->field_0xd0 + (long)pp_Var7[-3]);
      auVar24._4_4_ = uVar1;
      auVar24._0_4_ = uVar1;
      auVar24._8_4_ = uVar1;
      auVar24._12_4_ = uVar1;
      auVar22 = vfmadd213ps_fma(auVar24,auVar9,auVar22);
      auVar22 = vmaxps_avx(auVar22,ZEXT816(0) << 0x40);
      auVar22 = vminps_avx(auVar22,auVar19);
      auVar20._0_4_ = auVar22._0_4_ * auVar9._0_4_;
      auVar20._4_4_ = auVar22._4_4_ * auVar9._4_4_;
      auVar20._8_4_ = auVar22._8_4_ * auVar9._8_4_;
      auVar20._12_4_ = auVar22._12_4_ * auVar9._12_4_;
      *(undefined1 (*) [16])*pauVar14 = auVar20;
      pauVar14 = (undefined1 (*) [32])(*pauVar14 + 0x10);
      lVar15 = lVar15 + 4;
    }
    pp_Var7 = this->_vptr_HardSwish_x86_fma;
    lVar16 = sVar6 * sVar5 * uVar13;
    for (; (int)lVar15 < iVar11; lVar15 = lVar15 + 1) {
      fVar2 = *(float *)((long)pvVar4 + lVar15 * 4 + lVar16);
      p_Var8 = pp_Var7[-3];
      fVar21 = 0.0;
      if (fVar2 < *(float *)(&this->field_0xd8 + (long)p_Var8)) {
LAB_00449270:
        *(float *)((long)pvVar4 + lVar15 * 4 + lVar16) = fVar21;
      }
      else if (fVar2 <= *(float *)(&this->field_0xdc + (long)p_Var8)) {
        auVar9 = vfmadd213ss_fma(ZEXT416(*(uint *)(&this->field_0xd0 + (long)p_Var8)),
                                 ZEXT416((uint)fVar2),
                                 ZEXT416(*(uint *)(&this->field_0xd4 + (long)p_Var8)));
        fVar21 = auVar9._0_4_ * fVar2;
        goto LAB_00449270;
      }
    }
    uVar13 = uVar13 + 1;
  } while( true );
}

Assistant:

int HardSwish_x86_fma::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int d = bottom_top_blob.d;
    int channels = bottom_top_blob.c;
    int elempack = bottom_top_blob.elempack;
    int size = w * h * d * elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        __m512 _zero_avx512 = _mm512_setzero_ps();
        __m512 _one_avx512 = _mm512_set1_ps(1.f);
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            __m512 _ans = _mm512_set1_ps(beta);
            _ans = _mm512_fmadd_ps(_p, _mm512_set1_ps(alpha), _ans);
            _ans = _mm512_max_ps(_ans, _zero_avx512);
            _ans = _mm512_min_ps(_ans, _one_avx512);
            _ans = _mm512_mul_ps(_ans, _p);
            _mm512_storeu_ps(ptr, _ans);
            ptr += 16;
        }
#endif // __AVX512F__
        __m256 _zero_avx = _mm256_setzero_ps();
        __m256 _one_avx = _mm256_set1_ps(1.f);
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            __m256 _ans = _mm256_set1_ps(beta);
            _ans = _mm256_comp_fmadd_ps(_p, _mm256_set1_ps(alpha), _ans);
            _ans = _mm256_max_ps(_ans, _zero_avx);
            _ans = _mm256_min_ps(_ans, _one_avx);
            _ans = _mm256_mul_ps(_ans, _p);
            _mm256_storeu_ps(ptr, _ans);
            ptr += 8;
        }
#endif // __AVX__
        __m128 _zero = _mm_setzero_ps();
        __m128 _one = _mm_set1_ps(1.f);
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            __m128 _ans = _mm_set1_ps(beta);
            _ans = _mm_add_ps(_mm_mul_ps(_p, _mm_set1_ps(alpha)), _ans);
            _ans = _mm_max_ps(_ans, _zero);
            _ans = _mm_min_ps(_ans, _one);
            _ans = _mm_mul_ps(_ans, _p);
            _mm_store_ps(ptr, _ans);
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            if (*ptr < lower)
                *ptr = 0.f;
            else if (*ptr > upper)
                ;
            else
                *ptr = *ptr * (*ptr * alpha + beta);
            ptr++;
        }
    }

    return 0;
}